

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventplayer.cxx
# Opt level: O3

void __thiscall EventPlayer::prepareNextState(EventPlayer *this)

{
  prepareNextState((EventPlayer *)
                   &this[-1].super_StochasticEventGenerator.super_StochasticVariable.
                    super_StochasticProcess.stochDescription.field_2);
  return;
}

Assistant:

void EventPlayer::prepareNextState()
{
	if (!stochNextStateIsPrepared) {
		playerNextValue = 0;
        eventNextValue = false;
		for (; playerBufferPosition < playerBuffer.size() && playerBuffer[playerBufferPosition] <= xTime->timePassed; playerBufferPosition++) {
			playerNextValue++;
			stochNextValue += 1.0;
            eventNextValue = true;
		}
		
		stochNextStateIsPrepared = true;
	}
}